

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpcollisionlist.cpp
# Opt level: O3

void __thiscall
jrtplib::RTPCollisionList::Timeout
          (RTPCollisionList *this,RTPTime *currenttime,RTPTime *timeoutdelay)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  RTPMemoryManager *pRVar3;
  _Self __tmp;
  _List_node_base *p_Var4;
  double dVar5;
  
  p_Var4 = (this->addresslist).
           super__List_base<jrtplib::RTPCollisionList::AddressAndTime,_std::allocator<jrtplib::RTPCollisionList::AddressAndTime>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var4 != (_List_node_base *)&this->addresslist) {
    dVar5 = currenttime->m_t - timeoutdelay->m_t;
    do {
      if (dVar5 < (double)p_Var4[1]._M_prev || dVar5 == (double)p_Var4[1]._M_prev) {
        p_Var4 = p_Var4->_M_next;
      }
      else {
        p_Var2 = p_Var4[1]._M_next;
        pRVar3 = (this->super_RTPMemoryObject).mgr;
        if (pRVar3 == (RTPMemoryManager *)0x0) {
          if (p_Var2 != (_List_node_base *)0x0) {
            (**(code **)((long)p_Var2->_M_next + 0x20))(p_Var2);
          }
        }
        else {
          (**(code **)((long)p_Var2->_M_next + 0x18))(p_Var2);
          (**(code **)(*(long *)pRVar3 + 0x18))(pRVar3,p_Var2);
        }
        p_Var2 = p_Var4->_M_next;
        psVar1 = &(this->addresslist).
                  super__List_base<jrtplib::RTPCollisionList::AddressAndTime,_std::allocator<jrtplib::RTPCollisionList::AddressAndTime>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var4,0x20);
        p_Var4 = p_Var2;
      }
    } while (p_Var4 != (_List_node_base *)&this->addresslist);
  }
  return;
}

Assistant:

void RTPCollisionList::Timeout(const RTPTime &currenttime,const RTPTime &timeoutdelay)
{
	std::list<AddressAndTime>::iterator it;
	RTPTime checktime = currenttime;
	checktime -= timeoutdelay;
	
	it = addresslist.begin();
	while(it != addresslist.end())
	{
		if ((*it).recvtime < checktime) // timeout
		{
			RTPDelete((*it).addr,GetMemoryManager());
			it = addresslist.erase(it);	
		}
		else
			it++;
	}
}